

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pragmaVtabConnect(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr
                     )

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  sqlite3_vtab *psVar5;
  undefined8 uVar6;
  long lVar7;
  char cVar8;
  char zBuf [200];
  sqlite3_str local_128;
  sqlite3_vtab **local_108;
  char **local_100;
  char local_f8 [200];
  
  local_128.zText = local_f8;
  lVar7 = 0;
  local_128.db = (sqlite3 *)0x0;
  local_128.nAlloc = 200;
  local_128.mxAlloc = 0;
  local_128.nChar = 0;
  local_128.accError = '\0';
  local_128.printfFlags = '\0';
  local_100 = pzErr;
  sqlite3_str_append(&local_128,"CREATE TABLE x",0xe);
  if (*(char *)((long)pAux + 0xb) != '\0') {
    bVar1 = *(byte *)((long)pAux + 10);
    uVar6 = 0x28;
    lVar7 = 0;
    local_108 = ppVtab;
    do {
      sqlite3_str_appendf(&local_128,"%c\"%s\"",uVar6,pragCName[lVar7 + (ulong)bVar1]);
      lVar7 = lVar7 + 1;
      uVar6 = 0x2c;
      ppVtab = local_108;
    } while ((uint)lVar7 < (uint)*(byte *)((long)pAux + 0xb));
  }
  if ((int)lVar7 == 0) {
    sqlite3_str_appendf(&local_128,"(\"%s\"",*pAux);
    lVar7 = 1;
  }
  cVar8 = (*(byte *)((long)pAux + 9) & 0x20) != 0;
  if ((bool)cVar8) {
    sqlite3_str_append(&local_128,",arg HIDDEN",0xb);
  }
  if (0x3f < *(byte *)((long)pAux + 9)) {
    sqlite3_str_append(&local_128,",schema HIDDEN",0xe);
    cVar8 = cVar8 + '\x01';
  }
  uVar3 = (ulong)local_128.nChar;
  if (local_128.nChar + 1 < local_128.nAlloc) {
    local_128.nChar = local_128.nChar + 1;
    local_128.zText[uVar3] = ')';
  }
  else {
    enlargeAndAppend(&local_128,")",1);
  }
  sqlite3StrAccumFinish(&local_128);
  iVar2 = sqlite3_declare_vtab(db,local_f8);
  if (iVar2 == 0) {
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      psVar5 = (sqlite3_vtab *)sqlite3Malloc(0x30);
    }
    else {
      psVar5 = (sqlite3_vtab *)0x0;
    }
    iVar2 = 0;
    if (psVar5 == (sqlite3_vtab *)0x0) {
      iVar2 = 7;
      psVar5 = (sqlite3_vtab *)0x0;
    }
    else {
      *(undefined8 *)&psVar5[1].nRef = 0;
      psVar5[1].zErrMsg = (char *)0x0;
      psVar5->zErrMsg = (char *)0x0;
      psVar5[1].pModule = (sqlite3_module *)0x0;
      psVar5->pModule = (sqlite3_module *)0x0;
      *(undefined8 *)&psVar5->nRef = 0;
      *(void **)&psVar5[1].nRef = pAux;
      psVar5[1].pModule = (sqlite3_module *)db;
      *(char *)((long)&psVar5[1].zErrMsg + 1) = (char)lVar7;
      *(char *)&psVar5[1].zErrMsg = cVar8;
    }
  }
  else {
    pcVar4 = sqlite3_errmsg(db);
    psVar5 = (sqlite3_vtab *)0x0;
    pcVar4 = sqlite3_mprintf("%s",pcVar4);
    *local_100 = pcVar4;
  }
  *ppVtab = psVar5;
  return iVar2;
}

Assistant:

static int pragmaVtabConnect(
  sqlite3 *db,
  void *pAux,
  int argc, const char *const*argv,
  sqlite3_vtab **ppVtab,
  char **pzErr
){
  const PragmaName *pPragma = (const PragmaName*)pAux;
  PragmaVtab *pTab = 0;
  int rc;
  int i, j;
  char cSep = '(';
  StrAccum acc;
  char zBuf[200];

  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
  sqlite3_str_appendall(&acc, "CREATE TABLE x");
  for(i=0, j=pPragma->iPragCName; i<pPragma->nPragCName; i++, j++){
    sqlite3_str_appendf(&acc, "%c\"%s\"", cSep, pragCName[j]);
    cSep = ',';
  }
  if( i==0 ){
    sqlite3_str_appendf(&acc, "(\"%s\"", pPragma->zName);
    i++;
  }
  j = 0;
  if( pPragma->mPragFlg & PragFlg_Result1 ){
    sqlite3_str_appendall(&acc, ",arg HIDDEN");
    j++;
  }
  if( pPragma->mPragFlg & (PragFlg_SchemaOpt|PragFlg_SchemaReq) ){
    sqlite3_str_appendall(&acc, ",schema HIDDEN");
    j++;
  }
  sqlite3_str_append(&acc, ")", 1);
  sqlite3StrAccumFinish(&acc);
  assert( strlen(zBuf) < sizeof(zBuf)-1 );
  rc = sqlite3_declare_vtab(db, zBuf);
  if( rc==SQLITE_OK ){
    pTab = (PragmaVtab*)sqlite3_malloc(sizeof(PragmaVtab));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pTab, 0, sizeof(PragmaVtab));
      pTab->pName = pPragma;
      pTab->db = db;
      pTab->iHidden = i;
      pTab->nHidden = j;
    }
  }else{
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }

  *ppVtab = (sqlite3_vtab*)pTab;
  return rc;
}